

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

void resampler_write_sample(void *_r,short s)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (*(char *)((long)_r + 0x31) < '\0') {
    *(undefined1 *)((long)_r + 0x31) = 0;
    uVar3 = 0xf;
    if (*(char *)((long)_r + 0x30) != '\x05') {
      uVar3 = (uint)(*(char *)((long)_r + 0x30) == '\x04');
    }
    *(uint *)((long)_r + 4) = uVar3;
  }
  iVar1 = *(int *)((long)_r + 4);
  if (iVar1 < 0x40) {
    iVar2 = *_r;
    *(float *)((long)_r + (long)iVar2 * 4 + 0x48) = (float)(int)s * 256.0;
    *(float *)((long)_r + (long)iVar2 * 4 + 0x148) = (float)(int)s * 256.0;
    *(int *)((long)_r + 4) = iVar1 + 1;
    uVar3 = iVar2 + 0x40;
    if (-1 < (int)(iVar2 + 1U)) {
      uVar3 = iVar2 + 1U;
    }
    *(uint *)_r = (iVar2 - (uVar3 & 0xffffffc0)) + 1;
  }
  return;
}

Assistant:

void resampler_write_sample(void *_r, short s)
{
    resampler * r = ( resampler * ) _r;

    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        float s32 = s;
        s32 *= 256.0;

        r->buffer_in[ r->write_pos ] = s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = s32;

        ++r->write_filled;

        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}